

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,matrix4f *m)

{
  ostream *poVar1;
  char *pcVar2;
  _anonymous_namespace_ *p_Var3;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::operator<<(ofs,"( ");
  pcVar2 = "(";
  poVar1 = std::operator<<(ofs,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_b0,(_anonymous_namespace_ *)pcVar2,m->m[0][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_b0);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_50,p_Var3,m->m[0][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var3,m->m[0][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var3,m->m[0][3]);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,"), ");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pcVar2 = "(";
  poVar1 = std::operator<<(ofs,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_b0,(_anonymous_namespace_ *)pcVar2,m->m[1][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_b0);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_50,p_Var3,m->m[1][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var3,m->m[1][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var3,m->m[1][3]);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,"), ");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pcVar2 = "(";
  poVar1 = std::operator<<(ofs,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_b0,(_anonymous_namespace_ *)pcVar2,m->m[2][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_b0);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_50,p_Var3,m->m[2][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var3,m->m[2][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var3,m->m[2][3]);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,"), ");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pcVar2 = "(";
  poVar1 = std::operator<<(ofs,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_b0,(_anonymous_namespace_ *)pcVar2,m->m[3][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_b0);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_50,p_Var3,m->m[3][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var3,m->m[3][2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  p_Var3 = (_anonymous_namespace_ *)0x2f3804;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var3,m->m[3][3]);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,")");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::operator<<(ofs," )");
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::matrix4f &m) {
  ofs << "( ";

  ofs << "(" << tinyusdz::dtos(m.m[0][0]) << ", " << tinyusdz::dtos(m.m[0][1])
      << ", " << tinyusdz::dtos(m.m[0][2]) << ", " << tinyusdz::dtos(m.m[0][3])
      << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[1][0]) << ", " << tinyusdz::dtos(m.m[1][1])
      << ", " << tinyusdz::dtos(m.m[1][2]) << ", " << tinyusdz::dtos(m.m[1][3])
      << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[2][0]) << ", " << tinyusdz::dtos(m.m[2][1])
      << ", " << tinyusdz::dtos(m.m[2][2]) << ", " << tinyusdz::dtos(m.m[2][3])
      << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[3][0]) << ", " << tinyusdz::dtos(m.m[3][1])
      << ", " << tinyusdz::dtos(m.m[3][2]) << ", " << tinyusdz::dtos(m.m[3][3])
      << ")";

  ofs << " )";

  return ofs;
}